

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing.cc
# Opt level: O2

int memicmp(void *s1,void *s2,size_t len)

{
  int iVar1;
  char *pcVar2;
  size_t i;
  size_t sVar3;
  __array x1;
  __array x2;
  _Head_base<0UL,_char_*,_false> local_38;
  _Head_base<0UL,_char_*,_false> local_30;
  
  pcVar2 = (char *)operator_new__(len);
  memset(pcVar2,0,len);
  local_38._M_head_impl = pcVar2;
  pcVar2 = (char *)operator_new__(len);
  memset(pcVar2,0,len);
  local_30._M_head_impl = pcVar2;
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = tolower((int)*(char *)((long)s1 + sVar3));
    local_38._M_head_impl[sVar3] = (char)iVar1;
    iVar1 = tolower((int)*(char *)((long)s2 + sVar3));
    pcVar2[sVar3] = (char)iVar1;
  }
  iVar1 = memcmp(local_38._M_head_impl,pcVar2,len);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_30);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  return iVar1;
}

Assistant:

int
memicmp( const void* s1, const void* s2, size_t len )
{
    const auto x1 = std::make_unique<char[]>(len);
    const auto x2 = std::make_unique<char[]>(len);

    for (size_t i = 0; i < len; ++i) {
        x1[i] = tolower(static_cast<const char*>(s1)[i]);
        x2[i] = tolower(static_cast<const char*>(s2)[i]);
    }
    return memcmp(x1.get(), x2.get(), len);
}